

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

Var Js::JavascriptNumber::EntryIsSafeInteger(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  double dVar6;
  int in_stack_00000010;
  undefined1 local_68 [8];
  ArgumentReader args;
  CallInfo local_40;
  CallInfo callInfo_local;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_40 = callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != local_40._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x20f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00cea132;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])local_40;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_68,&local_40);
  if (((ulong)local_68 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x210,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) goto LAB_00cea132;
    *puVar4 = 0;
  }
  callInfo_local =
       (CallInfo)
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x213,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00cea132;
    *puVar4 = 0;
  }
  if (((ulong)local_68 & 0xfffffe) == 0) {
LAB_00ce9ff8:
    return *(Var *)(*(long *)((long)callInfo_local + 8) + 0x3f0);
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_68,1);
  BVar3 = JavascriptOperators::IsAnyNumberValue(pvVar5);
  if (BVar3 == 0) goto LAB_00ce9ff8;
  pvVar5 = Arguments::operator[]((Arguments *)local_68,1);
  if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00cea132;
    *puVar4 = 0;
  }
  if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    args.super_Arguments.Values = (Type)(double)(int)pvVar5;
  }
  else if ((ulong)pvVar5 >> 0x32 == 0) {
    args.super_Arguments.Values =
         (Type)JavascriptConversion::ToNumber_Full(pvVar5,(ScriptContext *)callInfo_local);
  }
  else {
    args.super_Arguments.Values = (Type)((ulong)pvVar5 ^ 0xfffc000000000000);
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_68,1);
  if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00cea132:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    dVar6 = (double)(int)pvVar5;
  }
  else {
    dVar6 = JavascriptConversion::ToInteger_Full(pvVar5,(ScriptContext *)callInfo_local);
  }
  pvVar5 = JavascriptBoolean::ToVar
                     ((uint)(byte)((double)args.super_Arguments.Values <= 9007199254740991.0 &
                                  -(-9007199254740991.0 <= (double)args.super_Arguments.Values) &
                                  -(dVar6 == (double)args.super_Arguments.Values)),
                      (ScriptContext *)callInfo_local);
  return pvVar5;
}

Assistant:

Var JavascriptNumber::EntryIsSafeInteger(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Number_Constructor_isSafeInteger);

        if (args.Info.Count < 2 || !JavascriptOperators::IsAnyNumberValue(args[1]))
        {
            return scriptContext->GetLibrary()->GetFalse();
        }

        double number = JavascriptConversion::ToNumber(args[1], scriptContext);

        return JavascriptBoolean::ToVar(
            number == JavascriptConversion::ToInteger(args[1], scriptContext) &&
            number >= Js::Math::MIN_SAFE_INTEGER && number <= Js::Math::MAX_SAFE_INTEGER,
            scriptContext);
    }